

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

Gia_Man_t * Kf_ManDerive(Kf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  undefined8 uVar3;
  word *pwVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  int *__ptr;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t __size;
  long lVar10;
  long lVar11;
  Gia_Man_t *pGVar12;
  
  pJVar2 = p->pPars;
  if (pJVar2->fCutMin != 0) {
    __assert_fail("!p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0x4f4,"Gia_Man_t *Kf_ManDerive(Kf_Man_t *)");
  }
  pGVar12 = p->pGia;
  uVar5 = pGVar12->nObjs;
  iVar6 = (int)pJVar2->Edge + uVar5;
  iVar1 = (int)pJVar2->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < (iVar6 + iVar1 * 2) - 1U) {
    iVar7 = iVar6 + iVar1 * 2;
  }
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar5 < 1) goto LAB_0076380c;
    __size = (ulong)uVar5 * 4;
LAB_007637dd:
    __ptr = (int *)malloc(__size);
LAB_007637e5:
    p_00->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar5;
  }
  else {
    __ptr = (int *)malloc((long)iVar7 << 2);
    p_00->pArray = __ptr;
    if (iVar7 < (int)uVar5) {
      __size = (long)(int)uVar5 << 2;
      if (__ptr == (int *)0x0) goto LAB_007637dd;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_007637e5;
    }
  }
  if (0 < (int)uVar5) {
    memset(__ptr,0,(ulong)uVar5 * 4);
  }
LAB_0076380c:
  p_00->nSize = uVar5;
  if (0 < pGVar12->nObjs) {
    lVar10 = 0;
    do {
      if (pGVar12->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(pGVar12->pObjs + lVar10);
      uVar5 = (uint)uVar3;
      if (((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) &&
         ((((uVar5 & 0x1fffffff) == 0x1fffffff ||
           ((uVar5 & 0x1fffffff) != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) &&
          (pGVar12->pRefs[lVar10] != 0)))) {
        if ((p->vCuts).nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar5 = (p->vCuts).pArray[lVar10];
        if (p_00->nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pwVar4 = (p->pMem).pPages[(int)uVar5 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar8 = (long)(int)(uVar5 & (p->pMem).uPageMask);
        lVar11 = (long)*(int *)((long)pwVar4 + lVar8 * 8 + 4);
        p_00->pArray[lVar10] = p_00->nSize;
        Vec_IntPush(p_00,*(int *)((long)pwVar4 + lVar11 * 4 + lVar8 * 8));
        if (0 < *(int *)((long)pwVar4 + lVar11 * 4 + lVar8 * 8)) {
          lVar9 = 0;
          do {
            uVar5 = *(uint *)((long)pwVar4 + lVar9 * 4 + lVar11 * 4 + lVar8 * 8 + 4);
            if ((int)uVar5 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            Vec_IntPush(p_00,uVar5 >> 1);
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)((long)pwVar4 + lVar11 * 4 + lVar8 * 8));
        }
        Vec_IntPush(p_00,(int)lVar10);
        pGVar12 = p->pGia;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pGVar12->nObjs);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0x502,"Gia_Man_t *Kf_ManDerive(Kf_Man_t *)");
  }
  pGVar12->vMapping = p_00;
  return pGVar12;
}

Assistant:

Gia_Man_t * Kf_ManDerive( Kf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Gia_Obj_t * pObj; 
    int i, k, * pCut;
    assert( !p->pPars->fCutMin );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Kf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Kf_CutSize(pCut) );
        for ( k = 1; k <= Kf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, Kf_CutLeaf(pCut, k) );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
//    Gia_ManMappingVerify( p->pGia );
    return p->pGia;
}